

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cw-bwt.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  pointer puVar1;
  pointer puVar2;
  pointer pPVar3;
  pointer puVar4;
  uint k;
  long lVar5;
  long lVar6;
  ostream *poVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  string path;
  vector<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
  local_328;
  undefined1 local_310 [120];
  pointer puStack_298;
  pointer local_290;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_288;
  ulint local_270;
  uint uStack_268;
  uint uStack_264;
  ulint uStack_260;
  ulint uStack_258;
  bool local_250;
  undefined3 uStack_24f;
  uint uStack_24c;
  uint uStack_248;
  undefined4 uStack_244;
  BackwardIterator *local_240;
  vector<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_> local_238;
  vector<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
  local_220;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_208;
  undefined1 local_1f0 [16];
  pointer local_1e0;
  double local_1d8;
  double dStack_1d0;
  cw_bwt local_1c8;
  long local_78;
  string local_70;
  string local_50;
  
  if (argc - 5U < 0xfffffffe) {
    std::operator<<((ostream *)&std::cout,
                    "*** context-wise BWT construction in compressed space ***\n");
    std::operator<<((ostream *)&std::cout,"Usage: cw-bwt text_file bwt_file [k]\n");
    std::operator<<((ostream *)&std::cout,"where:\n");
    std::operator<<((ostream *)&std::cout,
                    "- text_file is the input text file. Input file must not contain a 0x0 byte since the algorithm uses it as text terminator.\n"
                   );
    std::operator<<((ostream *)&std::cout,
                    "- bwt_file is the output bwt file. This output file will contain a 0x0 terminator and thus will be 1 byte longer than the input file.\n"
                   );
    std::operator<<((ostream *)&std::cout,
                    "- k (automatically detected if not specified) is the entropy order (context length).\n"
                   );
    std::operator<<((ostream *)&std::cout,
                    "WARNING: for high values of k, the memory requirements approach n log n. If you specify k, choose it carefully!\n"
                   );
    std::operator<<((ostream *)&std::cout,"For more informations, read the file README.\n");
    exit(0);
  }
  lVar5 = std::chrono::_V2::system_clock::now();
  local_1c8.ca.remapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.ca.remapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c8.ca.inverse_remapping.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.ca.inverse_remapping.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.ca.inverse_remapping.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c8.ca.remapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.ca.prefix_nr.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.ca.prefix_nr.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.ca.prefix_nr.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c8.ca.edges.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.ca.edges.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.ca.edges.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c8.partial_sums.super__Vector_base<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.partial_sums.super__Vector_base<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.partial_sums.super__Vector_base<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c8.dynStrings.
  super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.dynStrings.
  super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.dynStrings.
  super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c8.frequencies.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.frequencies.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.frequencies.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c8.lengths.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.lengths.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.lengths.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (argc == 4) {
    local_1c8.lengths.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1c8.lengths.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1c8.lengths.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1c8.frequencies.
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1c8.frequencies.
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1c8.frequencies.
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1c8.dynStrings.
    super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1c8.dynStrings.
    super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1c8.dynStrings.
    super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1c8.partial_sums.
    super__Vector_base<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1c8.partial_sums.
    super__Vector_base<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1c8.partial_sums.
    super__Vector_base<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1c8.ca.edges.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1c8.ca.edges.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1c8.ca.edges.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1c8.ca.prefix_nr.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1c8.ca.prefix_nr.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1c8.ca.prefix_nr.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1c8.ca.remapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1c8.ca.remapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1c8.ca.remapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1c8.ca.inverse_remapping.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1c8.ca.inverse_remapping.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1c8.ca.inverse_remapping.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    std::__cxx11::string::string((string *)&local_70,argv[1],(allocator *)local_310);
    k = atoi(argv[3]);
    bwtil::cw_bwt::cw_bwt((cw_bwt *)local_310,&local_70,path,k,true);
    puVar1 = local_1c8.ca.inverse_remapping.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_1c8.number_of_contexts = local_310._0_8_;
    local_1c8.terminator_position = local_310._8_8_;
    local_1c8._16_8_ = local_310._16_8_;
    local_1c8.n = local_310._24_8_;
    local_1c8.ca._0_8_ = local_310._32_8_;
    local_1c8.ca.bwIt = (BackwardIterator *)local_310._40_8_;
    local_1c8.ca.inverse_remapping.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_310._64_8_;
    local_1c8.ca.inverse_remapping.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_310._48_8_;
    local_1c8.ca.inverse_remapping.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_310._56_8_;
    local_310._48_8_ = (pointer)0x0;
    local_310._56_8_ = (pointer)0x0;
    local_310._64_8_ = (pointer)0x0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
    }
    puVar2 = local_1c8.ca.remapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_1c8.ca.remapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_310._88_8_;
    local_1c8.ca.remapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_310._72_8_;
    local_1c8.ca.remapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_310._80_8_;
    local_310._72_8_ = (pointer)0x0;
    local_310._80_8_ = (pointer)0x0;
    local_310._88_8_ = (pointer)0x0;
    if (puVar2 != (pointer)0x0) {
      operator_delete(puVar2);
    }
    puVar2 = local_1c8.ca.prefix_nr.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_1c8.ca.null_ptr = local_310._104_4_;
    local_1c8.ca.current_state = local_310._96_8_;
    local_1c8.ca.prefix_nr.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_290;
    local_1c8.ca.prefix_nr.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_310._112_8_;
    local_1c8.ca.prefix_nr.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puStack_298;
    register0x00001200 = ZEXT816(0) << 0x20;
    local_290 = (pointer)0x0;
    if (puVar2 != (pointer)0x0) {
      operator_delete(puVar2);
    }
    local_328.
    super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)local_1c8.ca.edges.
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_328.
    super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)local_1c8.ca.edges.
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    local_328.
    super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)local_1c8.ca.edges.
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_1c8.ca.edges.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_288.
         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_1c8.ca.edges.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_288.
         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_1c8.ca.edges.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_288.
         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_288.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_288.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_288.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)&local_328);
    local_328.
    super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)local_1c8.partial_sums.
                  super__Vector_base<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
    pPVar3 = local_1c8.partial_sums.
             super__Vector_base<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_328.
    super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)local_1c8.partial_sums.
                  super__Vector_base<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    local_1c8.ca.number_of_k_mers = local_270;
    local_1c8.ca.sigma = uStack_268;
    local_1c8.ca.k = uStack_264;
    local_1c8.ca.sigma_pow_k_minus_one = uStack_260;
    local_1c8.ca.n = uStack_258;
    local_1c8.verbose = local_250;
    local_1c8._193_3_ = uStack_24f;
    local_1c8.k = uStack_24c;
    local_1c8.sigma = uStack_248;
    local_1c8._204_4_ = uStack_244;
    local_1c8.bwIt = local_240;
    local_1c8.partial_sums.
    super__Vector_base<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_238.super__Vector_base<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_1c8.partial_sums.
    super__Vector_base<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_238.super__Vector_base<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_1c8.partial_sums.
    super__Vector_base<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_238.super__Vector_base<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_328.
    super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = SUB168(ZEXT816(0),4);
    local_238.super__Vector_base<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)local_328.
                  super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    local_328.
    super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)pPVar3;
    local_238.super__Vector_base<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_238.super__Vector_base<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>::~vector
              ((vector<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_> *)&local_328);
    local_328.
    super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_1c8.dynStrings.
         super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_328.
    super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_1c8.dynStrings.
         super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_328.
    super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_1c8.dynStrings.
         super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_1c8.dynStrings.
    super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_220.
         super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_1c8.dynStrings.
    super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_220.
         super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_1c8.dynStrings.
    super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_220.
         super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_220.
    super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_220.
    super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_220.
    super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
    ::~vector(&local_328);
    local_328.
    super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)local_1c8.frequencies.
                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_328.
    super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)local_1c8.frequencies.
                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    local_328.
    super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)local_1c8.frequencies.
                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_1c8.frequencies.
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_208.
         super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_1c8.frequencies.
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_208.
         super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_1c8.frequencies.
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_208.
         super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_208.
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_208.
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_208.
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               *)&local_328);
    puVar4 = local_1c8.lengths.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_1c8.lengths.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_1e0;
    local_1c8.lengths.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_1f0._0_8_;
    local_1c8.lengths.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_1f0._8_8_;
    local_1f0 = ZEXT816(0) << 0x20;
    local_1e0 = (pointer)0x0;
    if (puVar4 != (pointer)0x0) {
      operator_delete(puVar4);
    }
    local_1c8.Hk = local_1d8;
    local_1c8.bits_per_symbol = dStack_1d0;
    if ((pointer)local_1f0._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_1f0._0_8_);
    }
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::~vector(&local_208);
    std::
    vector<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
    ::~vector(&local_220);
    std::vector<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>::~vector(&local_238);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::~vector(&local_288);
    if ((pointer)local_310._112_8_ != (pointer)0x0) {
      operator_delete((void *)local_310._112_8_);
    }
    if ((pointer)local_310._72_8_ != (pointer)0x0) {
      operator_delete((void *)local_310._72_8_);
    }
    if ((pointer)local_310._48_8_ != (pointer)0x0) {
      operator_delete((void *)local_310._48_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
  }
  else if (argc == 3) {
    std::__cxx11::string::string((string *)&local_70,argv[1],(allocator *)local_310);
    bwtil::cw_bwt::cw_bwt((cw_bwt *)local_310,&local_70,path,true);
    puVar1 = local_1c8.ca.inverse_remapping.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_1c8.number_of_contexts = local_310._0_8_;
    local_1c8.terminator_position = local_310._8_8_;
    local_1c8._16_8_ = local_310._16_8_;
    local_1c8.n = local_310._24_8_;
    local_1c8.ca._0_8_ = local_310._32_8_;
    local_1c8.ca.bwIt = (BackwardIterator *)local_310._40_8_;
    local_1c8.ca.inverse_remapping.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_310._64_8_;
    local_1c8.ca.inverse_remapping.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_310._48_8_;
    local_1c8.ca.inverse_remapping.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_310._56_8_;
    local_310._48_8_ = (pointer)0x0;
    local_310._56_8_ = (pointer)0x0;
    local_310._64_8_ = (pointer)0x0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
    }
    puVar2 = local_1c8.ca.remapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_1c8.ca.remapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_310._88_8_;
    local_1c8.ca.remapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_310._72_8_;
    local_1c8.ca.remapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_310._80_8_;
    local_310._72_8_ = (pointer)0x0;
    local_310._80_8_ = (pointer)0x0;
    local_310._88_8_ = (pointer)0x0;
    if (puVar2 != (pointer)0x0) {
      operator_delete(puVar2);
    }
    puVar2 = local_1c8.ca.prefix_nr.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_1c8.ca.null_ptr = local_310._104_4_;
    local_1c8.ca.current_state = local_310._96_8_;
    local_1c8.ca.prefix_nr.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_290;
    local_1c8.ca.prefix_nr.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_310._112_8_;
    local_1c8.ca.prefix_nr.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puStack_298;
    register0x00001200 = ZEXT816(0) << 0x20;
    local_290 = (pointer)0x0;
    if (puVar2 != (pointer)0x0) {
      operator_delete(puVar2);
    }
    local_328.
    super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)local_1c8.ca.edges.
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_328.
    super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)local_1c8.ca.edges.
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    local_328.
    super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)local_1c8.ca.edges.
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_1c8.ca.edges.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_288.
         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_1c8.ca.edges.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_288.
         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_1c8.ca.edges.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_288.
         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_288.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_288.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_288.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_78 = lVar5;
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)&local_328);
    local_328.
    super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)local_1c8.partial_sums.
                  super__Vector_base<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
    pPVar3 = local_1c8.partial_sums.
             super__Vector_base<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_328.
    super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)local_1c8.partial_sums.
                  super__Vector_base<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    local_1c8.ca.number_of_k_mers = local_270;
    local_1c8.ca.sigma = uStack_268;
    local_1c8.ca.k = uStack_264;
    local_1c8.ca.sigma_pow_k_minus_one = uStack_260;
    local_1c8.ca.n = uStack_258;
    local_1c8.verbose = local_250;
    local_1c8._193_3_ = uStack_24f;
    local_1c8.k = uStack_24c;
    local_1c8.sigma = uStack_248;
    local_1c8._204_4_ = uStack_244;
    local_1c8.bwIt = local_240;
    local_1c8.partial_sums.
    super__Vector_base<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_238.super__Vector_base<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_1c8.partial_sums.
    super__Vector_base<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_238.super__Vector_base<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_1c8.partial_sums.
    super__Vector_base<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_238.super__Vector_base<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_328.
    super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = SUB168(ZEXT816(0),4);
    local_238.super__Vector_base<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)local_328.
                  super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    local_328.
    super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)pPVar3;
    local_238.super__Vector_base<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_238.super__Vector_base<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>::~vector
              ((vector<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_> *)&local_328);
    local_328.
    super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_1c8.dynStrings.
         super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_328.
    super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_1c8.dynStrings.
         super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_328.
    super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_1c8.dynStrings.
         super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_1c8.dynStrings.
    super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_220.
         super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_1c8.dynStrings.
    super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_220.
         super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_1c8.dynStrings.
    super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_220.
         super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_220.
    super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_220.
    super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_220.
    super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
    ::~vector(&local_328);
    local_328.
    super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)local_1c8.frequencies.
                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_328.
    super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)local_1c8.frequencies.
                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    local_328.
    super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)local_1c8.frequencies.
                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_1c8.frequencies.
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_208.
         super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_1c8.frequencies.
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_208.
         super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_1c8.frequencies.
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_208.
         super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_208.
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_208.
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_208.
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               *)&local_328);
    puVar4 = local_1c8.lengths.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_1c8.lengths.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_1e0;
    local_1c8.lengths.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_1f0._0_8_;
    local_1c8.lengths.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_1f0._8_8_;
    local_1f0 = ZEXT816(0) << 0x20;
    local_1e0 = (pointer)0x0;
    if (puVar4 != (pointer)0x0) {
      operator_delete(puVar4);
    }
    local_1c8.Hk = local_1d8;
    local_1c8.bits_per_symbol = dStack_1d0;
    if ((pointer)local_1f0._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_1f0._0_8_);
    }
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::~vector(&local_208);
    std::
    vector<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
    ::~vector(&local_220);
    std::vector<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>::~vector(&local_238);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::~vector(&local_288);
    if ((pointer)local_310._112_8_ != (pointer)0x0) {
      operator_delete((void *)local_310._112_8_);
    }
    lVar5 = local_78;
    if ((pointer)local_310._72_8_ != (pointer)0x0) {
      operator_delete((void *)local_310._72_8_);
    }
    if ((pointer)local_310._48_8_ != (pointer)0x0) {
      operator_delete((void *)local_310._48_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
  }
  std::__cxx11::string::string((string *)&local_50,argv[2],(allocator *)local_310);
  bwtil::cw_bwt::toFile(&local_1c8,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  bwtil::printRSSstat(local_1c8.n + 1);
  lVar6 = std::chrono::_V2::system_clock::now();
  auVar9._8_8_ = 0;
  auVar9._0_8_ = (double)(lVar6 - lVar5) * 1e-09;
  uVar8 = vcvttsd2usi_avx512f(auVar9);
  if (uVar8 < 0xe10) {
    if (uVar8 < 0x3c) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Total time: ",0xc);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," seconds.",9);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Total time: ",0xc);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," seconds. (",0xb);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"m ",2);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"s",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Total time: ",0xc);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," seconds. (",0xb);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"h ",2);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"m ",2);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"s",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
  }
  if (local_1c8.lengths.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1c8.lengths.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&local_1c8.frequencies);
  std::
  vector<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
  ::~vector(&local_1c8.dynStrings);
  std::vector<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>::~vector
            (&local_1c8.partial_sums);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_1c8.ca.edges);
  if (local_1c8.ca.prefix_nr.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1c8.ca.prefix_nr.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1c8.ca.remapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1c8.ca.remapping.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1c8.ca.inverse_remapping.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1c8.ca.inverse_remapping.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main(int argc,char** argv) {

#ifdef DEBUG
	 cout << "\n ****** DEBUG MODE ******\n\n";
#endif

	if(argc != 3 and argc != 4){
		cout << "*** context-wise BWT construction in compressed space ***\n";
		cout << "Usage: cw-bwt text_file bwt_file [k]\n";
		cout << "where:\n";
		cout << "- text_file is the input text file. Input file must not contain a 0x0 byte since the algorithm uses it as text terminator.\n";
		cout << "- bwt_file is the output bwt file. This output file will contain a 0x0 terminator and thus will be 1 byte longer than the input file.\n";
		cout << "- k (automatically detected if not specified) is the entropy order (context length).\n";
		cout << "WARNING: for high values of k, the memory requirements approach n log n. If you specify k, choose it carefully!\n";
		cout << "For more informations, read the file README.\n";
		exit(0);
	}

    using std::chrono::high_resolution_clock;
    using std::chrono::duration_cast;
    using std::chrono::duration;

    auto t1 = high_resolution_clock::now();

	cw_bwt cwbwt;

	/*
	 * Note: in this example, the text is loaded from disk and the bwt is directly saved to disk. The total RAM occupancy is therefore COMPRESSED, i.e.
	 * comparable to the size of the compressed input text file.
	 *
	 * It is possible (see comments below) also to build the bwt from/to strings, but in this way also the input/output strings will be stored in memory,
	 * resulting in higher RAM requirements.
	 *
	 * If you want to keep RAM usage to a minimum, it is recommended that you proceed as follows:
	 *
	 * 1) save your text (string/array) to disk
	 * 2) free memory
	 * 3) run cw-bwt loading the text from the file created in step 1) (see below)
	 * 4) save directly the bwt to disk (see below)
	 * 5) free memory
	 * 6) load in RAM the bwt created in step 4)
	 *
	 */

	//build bwt from a text file:

	if(argc==3){//k autodetected
		string path(argv[1]);
		//cw_bwt::path means that the first argument has to be interpreted as a file path rather than a text string
		cwbwt = cw_bwt(path,cw_bwt::path,true);
	}
	if(argc==4){//the user has specified k
		string path(argv[1]);
		cwbwt = cw_bwt(path,cw_bwt::path,atoi(argv[3]),true);
	}
	/*
	 * If, instead, you want to compute the bwt of a string, create a cw_bwt object as follows:
	 *
	 *
	 * string str = "mississippi";
	 * cwbwt = cw_bwt(str,cw_bwt::text); // optimal k autodetected
	 *
	 * or
	 *
	 * cwbwt = cw_bwt(str,cw_bwt::text, your_k_value,true); // you choose k
	 *
	 * However, this requires more space in RAM since the input text string is kept in memory together with the structures of cwbwt
	 *
	 */

	//save to file the bwt without occupying additional RAM
	cwbwt.toFile(argv[2]);

	/*
	 * If, instead, you want a string object containing the bwt, call
	 *
	 * string bwt = cwbwt.toString();
	 *
	 * However, this requires more space in RAM since the string bwt is kept in memory together with the structures of cwbwt
	 * WARNING: if you directly print cwbwt.toString(), you won't see the terminator character since it is a 0x0 byte.
	 *
	 */

	printRSSstat(cwbwt.length());

	auto t2 = high_resolution_clock::now();
	ulint total = duration_cast<duration<double, std::ratio<1>>>(t2 - t1).count();

	if(total>=3600){

		uint h = total/3600;
		uint m = (total%3600)/60;
		uint s = (total%3600)%60;

		cout << "Total time: " << total << " seconds. ("<< h << "h " << m << "m " << s << "s" << ")"<<endl;

	}else if (total>=60){

		uint m = total/60;
		uint s = total%60;

		cout << "Total time: " << total << " seconds. ("<< m << "m " << s << "s" << ")"<<endl;

	}else{

		cout << "Total time: " << total << " seconds." << endl;

	}
 }